

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetInt32(char *zNum,int *pValue)

{
  long lVar1;
  byte bVar2;
  uint *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int neg;
  int c;
  int i;
  sqlite_int64 v;
  u32 u;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  byte *local_18;
  int local_10;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  local_30 = -0x55555556;
  local_34 = 0;
  if (*in_RDI == 0x2d) {
    local_34 = 1;
    local_18 = in_RDI + 1;
  }
  else if (*in_RDI == 0x2b) {
    local_18 = in_RDI + 1;
  }
  else {
    local_18 = in_RDI;
    if ((*in_RDI == 0x30) &&
       (((in_RDI[1] == 0x78 || (in_RDI[1] == 0x58)) && ((""[in_RDI[2]] & 8) != 0)))) {
      local_c = 0;
      for (local_18 = in_RDI + 2; *local_18 == 0x30; local_18 = local_18 + 1) {
      }
      local_2c = 0;
      while( true ) {
        bVar3 = false;
        if (local_2c < 8) {
          bVar3 = (""[local_18[local_2c]] & 8) != 0;
        }
        if (!bVar3) break;
        bVar2 = sqlite3HexToInt((int)(char)local_18[local_2c]);
        local_c = local_c * 0x10 + (uint)bVar2;
        local_2c = local_2c + 1;
      }
      if (((local_c & 0x80000000) == 0) && ((""[local_18[local_2c]] & 8) == 0)) {
        *in_RSI = local_c;
        local_10 = 1;
      }
      else {
        local_10 = 0;
      }
      goto LAB_0019e9b3;
    }
  }
  if ((""[*local_18] & 4) == 0) {
    local_10 = 0;
  }
  else {
    for (; *local_18 == 0x30; local_18 = local_18 + 1) {
    }
    local_2c = 0;
    while( true ) {
      bVar3 = false;
      if (local_2c < 0xb) {
        local_30 = (char)local_18[local_2c] + -0x30;
        bVar3 = false;
        if (-1 < local_30) {
          bVar3 = local_30 < 10;
        }
      }
      if (!bVar3) break;
      local_28 = local_28 * 10 + (long)local_30;
      local_2c = local_2c + 1;
    }
    if (local_2c < 0xb) {
      if (local_28 - local_34 < 0x80000000) {
        if (local_34 != 0) {
          local_28 = -local_28;
        }
        *in_RSI = (uint)local_28;
        local_10 = 1;
      }
      else {
        local_10 = 0;
      }
    }
    else {
      local_10 = 0;
    }
  }
LAB_0019e9b3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; i<8 && sqlite3Isxdigit(zNum[i]); i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}